

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void tcg_gen_vec_add32_i64_mips64(TCGContext_conflict5 *tcg_ctx,TCGv_i64 d,TCGv_i64 a,TCGv_i64 b)

{
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 t2;
  TCGv_i64 t1;
  TCGv_i64 b_local;
  TCGv_i64 a_local;
  TCGv_i64 d_local;
  TCGContext_conflict5 *tcg_ctx_local;
  
  ret = tcg_temp_new_i64(tcg_ctx);
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_andi_i64_mips64(tcg_ctx,ret,a,-0x100000000);
  tcg_gen_add_i64(tcg_ctx,ret_00,a,b);
  tcg_gen_add_i64(tcg_ctx,ret,ret,b);
  tcg_gen_deposit_i64_mips64(tcg_ctx,d,ret,ret_00,0,0x20);
  tcg_temp_free_i64(tcg_ctx,ret);
  tcg_temp_free_i64(tcg_ctx,ret_00);
  return;
}

Assistant:

void tcg_gen_vec_add32_i64(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 a, TCGv_i64 b)
{
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_andi_i64(tcg_ctx, t1, a, ~0xffffffffull);
    tcg_gen_add_i64(tcg_ctx, t2, a, b);
    tcg_gen_add_i64(tcg_ctx, t1, t1, b);
    tcg_gen_deposit_i64(tcg_ctx, d, t1, t2, 0, 32);

    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, t2);
}